

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

_Bool pick_and_place_distant_monster
                (chunk *c,loc_conflict to_avoid,wchar_t dis,_Bool sleep,wchar_t depth)

{
  _Bool _Var1;
  uint32_t x;
  uint32_t y;
  wchar_t wVar2;
  int local_38;
  loc_conflict lStack_34;
  wchar_t attempts_left;
  loc_conflict grid;
  wchar_t depth_local;
  _Bool sleep_local;
  wchar_t dis_local;
  chunk *c_local;
  loc_conflict to_avoid_local;
  
  local_38 = 10000;
  if (c == (chunk *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x8e3,
                  "_Bool pick_and_place_distant_monster(struct chunk *, struct loc, int, _Bool, int)"
                 );
  }
  do {
    local_38 = local_38 + -1;
    if (local_38 == 0) break;
    x = Rand_div(c->width);
    y = Rand_div(c->height);
    lStack_34 = (loc_conflict)loc(x,y);
    _Var1 = square_isempty(c,lStack_34);
  } while ((!_Var1) ||
          ((((character_dungeon & 1U) == 0 && (_Var1 = square_ismon_restrict(c,lStack_34), _Var1))
           || (wVar2 = distance((loc)lStack_34,(loc)to_avoid), wVar2 <= dis))));
  if (local_38 == 0) {
    if ((((player->opts).opt[0x1a] & 1U) != 0) || (((player->opts).opt[0x16] & 1U) != 0)) {
      msg("Warning! Could not allocate a new monster.");
    }
    to_avoid_local.x._3_1_ = false;
  }
  else {
    _Var1 = pick_and_place_monster(c,lStack_34,depth,sleep,true,'\n');
    if (_Var1) {
      to_avoid_local.x._3_1_ = true;
    }
    else {
      to_avoid_local.x._3_1_ = false;
    }
  }
  return to_avoid_local.x._3_1_;
}

Assistant:

bool pick_and_place_distant_monster(struct chunk *c, struct loc to_avoid,
		int dis, bool sleep, int depth)
{
	struct loc grid;
	int	attempts_left = 10000;

	assert(c);

	/* Find a legal, distant, unoccupied, space */
	while (--attempts_left) {
		/* Pick a location */
		grid = loc(randint0(c->width), randint0(c->height));

		/* Require "naked" floor grid */
		if (!square_isempty(c, grid)) continue;

		/* Do not put random monsters in marked rooms. */
		if ((!character_dungeon) && square_ismon_restrict(c, grid))
			continue;

		/* Accept far away grids */
		if (distance(grid, to_avoid) > dis) break;
	}

	if (!attempts_left) {
		if (OPT(player, cheat_xtra) || OPT(player, cheat_hear))
			msg("Warning! Could not allocate a new monster.");

		return false;
	}

	/* Attempt to place the monster, allow groups */
	if (pick_and_place_monster(c, grid, depth, sleep, true, ORIGIN_DROP))
		return (true);

	/* Nope */
	return (false);
}